

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_traversal_sequencer.h
# Opt level: O3

bool __thiscall
draco::
MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
::GenerateSequenceInternal
          (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
           *this)

{
  CornerTable *pCVar1;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *pvVar2;
  bool bVar3;
  bool bVar4;
  pointer pIVar5;
  ulong uVar6;
  CornerIndex corner_id;
  ulong uVar7;
  int iVar8;
  
  pCVar1 = (this->traverser_).
           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           .corner_table_;
  std::
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ::reserve((this->super_PointsSequencer).out_point_ids_,
            (long)(int)((ulong)((long)(pCVar1->vertex_corners_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pCVar1->vertex_corners_).vector_.
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2));
  pvVar2 = this->corner_order_;
  if (pvVar2 == (vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 *)0x0) {
    pCVar1 = (this->traverser_).
             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             .corner_table_;
    iVar8 = (int)((ulong)((long)(pCVar1->corner_to_vertex_map_).vector_.
                                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pCVar1->corner_to_vertex_map_).vector_.
                                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 2) / 3);
    if (0 < iVar8) {
      corner_id.value_ = 0;
      do {
        iVar8 = iVar8 + -1;
        bVar4 = DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                ::TraverseFromCorner(&this->traverser_,corner_id);
        if (!bVar4) {
          return bVar4;
        }
        corner_id.value_ = corner_id.value_ + 3;
      } while (iVar8 != 0);
      return bVar4;
    }
  }
  else {
    pIVar5 = (pvVar2->
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((pvVar2->
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pIVar5) {
      uVar6 = 0;
      uVar7 = 1;
      do {
        bVar4 = DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                ::TraverseFromCorner(&this->traverser_,(CornerIndex)pIVar5[uVar6].value_);
        if (!bVar4) {
          return bVar4;
        }
        pIVar5 = (this->corner_order_->
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar7 < (ulong)((long)(this->corner_order_->
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar5 >>
                               2);
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar3);
      return bVar4;
    }
  }
  return true;
}

Assistant:

bool GenerateSequenceInternal() override {
    // Preallocate memory for storing point indices. We expect the number of
    // points to be the same as the number of corner table vertices.
    out_point_ids()->reserve(traverser_.corner_table()->num_vertices());

    traverser_.OnTraversalStart();
    if (corner_order_) {
      for (uint32_t i = 0; i < corner_order_->size(); ++i) {
        if (!ProcessCorner(corner_order_->at(i))) {
          return false;
        }
      }
    } else {
      const int32_t num_faces = traverser_.corner_table()->num_faces();
      for (int i = 0; i < num_faces; ++i) {
        if (!ProcessCorner(CornerIndex(3 * i))) {
          return false;
        }
      }
    }
    traverser_.OnTraversalEnd();
    return true;
  }